

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

string * __thiscall
cnn::ConcatenateColumns::as_string
          (string *__return_storage_ptr__,ConcatenateColumns *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  ostringstream os;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"concat_cols(",0xc);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  if (0x20 < (ulong)((long)(arg_names->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arg_names->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    uVar4 = 1;
    uVar3 = 2;
    do {
      local_1a9 = ',';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1)
      ;
      pbVar1 = (arg_names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,pbVar1[uVar4]._M_dataplus._M_p,pbVar1[uVar4]._M_string_length);
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)(arg_names->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(arg_names->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_1a9 = ')';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string ConcatenateColumns::as_string(const vector<string>& arg_names) const {
  ostringstream os;
  os << "concat_cols(" << arg_names[0];
  for (unsigned i = 1; i < arg_names.size(); ++i) {
    os << ',' << arg_names[i];
  }
  os << ')';
  return os.str();
}